

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O1

uint64_t roaring64_bitmap_get_cardinality(roaring64_bitmap_t *r)

{
  art_key_chunk_t aVar1;
  int iVar2;
  uint64_t uVar3;
  run_container_t *run;
  art_iterator_t it;
  art_iterator_t aStack_98;
  
  art_init_iterator(&aStack_98,&r->art,true);
  uVar3 = 0;
  while (aStack_98.value != (art_val_t *)0x0) {
    run = *(run_container_t **)(aStack_98.value[1].key + 2);
    aVar1 = aStack_98.value[1].key[0];
    if (aVar1 == '\x04') {
      aVar1 = *(art_key_chunk_t *)&run->runs;
      run = *(run_container_t **)run;
    }
    if (aVar1 == '\x03') {
      iVar2 = run_container_cardinality(run);
    }
    else {
      iVar2 = run->n_runs;
    }
    uVar3 = uVar3 + (long)iVar2;
    art_iterator_next(&aStack_98);
  }
  return uVar3;
}

Assistant:

uint64_t roaring64_bitmap_get_cardinality(const roaring64_bitmap_t *r) {
    art_iterator_t it = art_init_iterator(&r->art, /*first=*/true);
    uint64_t cardinality = 0;
    while (it.value != NULL) {
        leaf_t *leaf = (leaf_t *)it.value;
        cardinality +=
            container_get_cardinality(leaf->container, leaf->typecode);
        art_iterator_next(&it);
    }
    return cardinality;
}